

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool __thiscall
NamedGeneratorTargetFinder::operator()(NamedGeneratorTargetFinder *this,cmGeneratorTarget *tgt)

{
  __type _Var1;
  string *__lhs;
  
  __lhs = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
  _Var1 = std::operator==(__lhs,&this->Name);
  return _Var1;
}

Assistant:

bool operator()(cmGeneratorTarget* tgt)
  {
    return tgt->GetName() == this->Name;
  }